

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O0

ByteString * __thiscall ByteString::substr(ByteString *this,size_t start,size_t len)

{
  size_type sVar1;
  ByteString *this_00;
  uchar *puVar2;
  uchar *in_RDX;
  size_t in_RSI;
  ByteString *in_RDI;
  size_t retLen;
  uchar *bytes;
  unsigned_long local_20;
  uchar *local_18;
  
  local_18 = in_RDX;
  sVar1 = std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_SecureAllocator<unsigned_char>_> *)(in_RSI + 8));
  this_00 = (ByteString *)(sVar1 - (long)local_18);
  std::min<unsigned_long>(&local_20,(unsigned_long *)&stack0xffffffffffffffd0);
  bytes = local_18;
  puVar2 = (uchar *)std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_SecureAllocator<unsigned_char>_> *)
                               (in_RSI + 8));
  if (bytes < puVar2) {
    std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_SecureAllocator<unsigned_char>_> *)(in_RSI + 8),
               (size_type)local_18);
    ByteString(this_00,bytes,in_RSI);
  }
  else {
    ByteString((ByteString *)0x13cdd8);
  }
  return in_RDI;
}

Assistant:

ByteString ByteString::substr(const size_t start, const size_t len /* = SIZE_T_MAX */) const
{
	size_t retLen = std::min(len, byteString.size() - start);

	if (start >= byteString.size())
	{
		return ByteString();
	}
	else
	{
		return ByteString(&byteString[start], retLen);
	}
}